

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O1

void anon_unknown.dwarf_56c85::PrintHeader(MallocExtensionWriter *writer,char *label,void **entries)

{
  void *pvVar1;
  uintptr_t size;
  uintptr_t count;
  
  pvVar1 = *entries;
  if (pvVar1 == (void *)0x0) {
    size = 0;
    count = 0;
  }
  else {
    count = 0;
    size = 0;
    do {
      count = count + (long)pvVar1;
      size = size + (long)entries[1];
      entries = entries + (long)entries[2] + 3;
      pvVar1 = *entries;
    } while (pvVar1 != (void *)0x0);
  }
  std::__cxx11::string::append((char *)writer,0x14a449);
  PrintCountAndSize(writer,count,size);
  std::__cxx11::string::append((char *)writer,0x14c029);
  strlen(label);
  std::__cxx11::string::append((char *)writer,(ulong)label);
  std::__cxx11::string::append((char *)writer,0x14c7c1);
  return;
}

Assistant:

void PrintHeader(MallocExtensionWriter* writer,
                 const char* label, void** entries) {
  // Compute the total count and total size
  uintptr_t total_count = 0;
  uintptr_t total_size = 0;
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    total_count += Count(entry);
    total_size += Size(entry);
  }

  const char* const kTitle = "heap profile: ";
  writer->append(kTitle, strlen(kTitle));
  PrintCountAndSize(writer, total_count, total_size);
  writer->append(" ", 1);
  writer->append(label, strlen(label));
  writer->append("\n", 1);
}